

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_shrinkToFit_failure_growStrategyNull_fn(int _i)

{
  size_t sVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  char **ppcVar7;
  size_t *psVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  ACUtilsGrowStrategy p_Var12;
  long lVar13;
  size_t local_68;
  char *local_60;
  size_t local_58 [2];
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.growStrategy = (ACUtilsGrowStrategy)0x0;
  array.capacity = 0;
  array.buffer = (char *)0x0;
  array.reallocator = private_ACUtilsTest_ADynArray_realloc;
  array.deallocator = private_ACUtilsTest_ADynArray_free;
  array.size = 7;
  local_58[1] = 0x10cf88;
  array.capacity = private_ACUtils_ADynArray_growStrategyGeneric(9,8,0x20,2.0,0x20);
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  local_58[1] = 0x10cf9c;
  array.buffer = (char *)(*array.reallocator)((void *)0x0,array.capacity);
  if (array.size != 1) {
    uVar4 = 0;
    do {
      array.buffer[uVar4] = '5';
      uVar4 = uVar4 + 1;
    } while (uVar4 < array.size - 1);
  }
  array.buffer[array.size - 1] = '0';
  array.growStrategy = (ACUtilsGrowStrategy)0x0;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  local_58[1] = 0x10cfe8;
  bVar2 = private_ACUtils_ADynArray_shrinkToFit(&array,1);
  if (bVar2 != false) {
    local_68 = (size_t)bVar2;
    psVar8 = &local_68;
    local_60 = "false";
    pcVar6 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar5 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar10 = "private_ACUtils_ADynArray_shrinkToFit(&array, sizeof(*(&array)->buffer)) == false";
    pcVar11 = "private_ACUtils_ADynArray_shrinkToFit(&array, sizeof(*(&array)->buffer))";
    iVar9 = 0x1bf;
LAB_0010d307:
    local_58[1] = 0;
    local_58[0] = 0;
    *(code **)((long)psVar8 + -8) = test_ADynArray_shrinkToFit_failure_nullptr_fn;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,iVar9,pcVar6,pcVar5,pcVar10,pcVar11);
  }
  local_58[1] = 0x10d001;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x1bf);
  if (array.size == 7) {
    local_58[1] = 0x10d021;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x1c0);
    sVar1 = array.capacity;
    local_58[1] = 0x10d047;
    sVar3 = private_ACUtils_ADynArray_growStrategyGeneric(9,8,0x20,2.0,0x20);
    if (sVar1 != sVar3) {
      local_58[1] = 0;
      local_60 = 
      "private_ACUtilsTest_ADynArray_growStrategy(private_ACUtilsTest_ADynArray_capacityMin + 1, sizeof(char))"
      ;
      local_68 = sVar1;
      local_58[0] = sVar3;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x1c1,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                        "array.capacity == private_ACUtilsTest_ADynArray_growStrategy(private_ACUtilsTest_ADynArray_capacityMin + 1, sizeof(char))"
                        ,"array.capacity");
    }
    local_58[1] = 0x10d061;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x1c1);
    if (array.buffer == (char *)0x0) {
      psVar8 = local_58;
      pcVar6 = "Assertion \'_ck_x != NULL\' failed";
      pcVar5 = "Assertion \'%s\' failed: %s == %#x";
      pcVar10 = "(void*) array.buffer != NULL";
      pcVar11 = "(void*) array.buffer";
      iVar9 = 0x1c2;
      goto LAB_0010d307;
    }
    local_58[1] = 0x10d081;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x1c2);
    lVar13 = 0;
    do {
      if ((ACUtilsGrowStrategy)(long)array.buffer[lVar13] != (ACUtilsGrowStrategy)0x35) {
        local_60 = "\'5\'";
        pcVar5 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
        pcVar6 = "array.buffer[i] == \'5\'";
        pcVar10 = "array.buffer[i]";
        iVar9 = 0x1c4;
        local_58[0] = 0x35;
        p_Var12 = (ACUtilsGrowStrategy)(long)array.buffer[lVar13];
        goto LAB_0010d159;
      }
      local_58[1] = 0x10d0a5;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x1c4);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 6);
    if ((ACUtilsGrowStrategy)(long)array.buffer[6] == (ACUtilsGrowStrategy)0x30) {
      local_58[1] = 0x10d0d3;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x1c5);
      if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
        local_58[1] = 0x10d0f2;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x1c6);
        if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
          local_58[1] = 0x10d113;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x1c7);
          local_58[1] = 0x10d11c;
          (*array.deallocator)(array.buffer);
          return;
        }
        psVar8 = &local_68;
        local_60 = "0";
        local_68 = private_ACUtilsTest_ADynArray_reallocCount;
        pcVar6 = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar5 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar10 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
        pcVar11 = "private_ACUtilsTest_ADynArray_reallocCount";
        iVar9 = 0x1c7;
        goto LAB_0010d307;
      }
      pcVar11 = "Assertion \'_ck_x == NULL\' failed";
      pcVar5 = "Assertion \'%s\' failed: %s == %#x";
      pcVar6 = "(void*) array.growStrategy == NULL";
      pcVar10 = "(void*) array.growStrategy";
      iVar9 = 0x1c6;
      ppcVar7 = (char **)(local_58 + 1);
      p_Var12 = array.growStrategy;
      goto LAB_0010d15b;
    }
    local_60 = "\'0\'";
    pcVar5 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
    pcVar6 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2] == \'0\'";
    pcVar10 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2]";
    iVar9 = 0x1c5;
    local_58[0] = 0x30;
    p_Var12 = (ACUtilsGrowStrategy)(long)array.buffer[6];
  }
  else {
    local_60 = "private_ACUtilsTest_ADynArray_capacityMin - 1";
    pcVar5 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar6 = "array.size == private_ACUtilsTest_ADynArray_capacityMin - 1";
    pcVar10 = "array.size";
    iVar9 = 0x1c0;
    local_58[0] = 7;
    p_Var12 = (ACUtilsGrowStrategy)array.size;
  }
LAB_0010d159:
  pcVar11 = "Assertion \'_ck_x == _ck_y\' failed";
  ppcVar7 = &local_60;
LAB_0010d15b:
  local_58[1] = 0;
  ppcVar7[0xffffffffffffffff] = (char *)p_Var12;
  ppcVar7[0xfffffffffffffffe] = (char *)0x10d162;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar9,pcVar11,pcVar5,pcVar6,pcVar10);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_shrinkToFit_failure_growStrategyNull)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin - 1;
    array.capacity = private_ACUtilsTest_ADynArray_growStrategy(private_ACUtilsTest_ADynArray_capacityMin + 1, sizeof(char));
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    array.growStrategy = nullptr;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_shrinkToFit(&array), false);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin - 1);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_growStrategy(private_ACUtilsTest_ADynArray_capacityMin + 1, sizeof(char)));
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 2; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2], '0');
    ACUTILSTEST_ASSERT_PTR_NULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}